

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenio::save_nodes(tetgenio *this,char *filebasename)

{
  FILE *pFVar1;
  int local_830;
  int local_82c;
  int j;
  int i;
  char outmtrfilename [1024];
  char outnodefilename [1024];
  FILE *fout;
  char *filebasename_local;
  tetgenio *this_local;
  
  sprintf(outmtrfilename + 0x3f8,"%s.node",filebasename);
  printf("Saving nodes to %s\n",outmtrfilename + 0x3f8);
  pFVar1 = fopen(outmtrfilename + 0x3f8,"w");
  fprintf(pFVar1,"%d  %d  %d  %d\n",(ulong)(uint)this->numberofpoints,(ulong)(uint)this->mesh_dim,
          (ulong)(uint)this->numberofpointattributes,(ulong)(this->pointmarkerlist != (int *)0x0));
  for (local_82c = 0; local_82c < this->numberofpoints; local_82c = local_82c + 1) {
    if (this->mesh_dim == 2) {
      fprintf(pFVar1,"%d  %.16g  %.16g",this->pointlist[local_82c * 3],
              this->pointlist[local_82c * 3 + 1],(ulong)(uint)(local_82c + this->firstnumber));
    }
    else {
      fprintf(pFVar1,"%d  %.16g  %.16g  %.16g",this->pointlist[local_82c * 3],
              this->pointlist[local_82c * 3 + 1],this->pointlist[local_82c * 3 + 2],
              (ulong)(uint)(local_82c + this->firstnumber));
    }
    for (local_830 = 0; local_830 < this->numberofpointattributes; local_830 = local_830 + 1) {
      fprintf(pFVar1,"  %.16g",
              this->pointattributelist[local_82c * this->numberofpointattributes + local_830]);
    }
    if (this->pointmarkerlist != (int *)0x0) {
      fprintf(pFVar1,"  %d",(ulong)(uint)this->pointmarkerlist[local_82c]);
    }
    fprintf(pFVar1,"\n");
  }
  fclose(pFVar1);
  if ((0 < this->numberofpointmtrs) && (this->pointmtrlist != (double *)0x0)) {
    sprintf((char *)&j,"%s.mtr",filebasename);
    printf("Saving metrics to %s\n",&j);
    pFVar1 = fopen((char *)&j,"w");
    fprintf(pFVar1,"%d  %d\n",(ulong)(uint)this->numberofpoints,(ulong)(uint)this->numberofpointmtrs
           );
    for (local_82c = 0; local_82c < this->numberofpoints; local_82c = local_82c + 1) {
      for (local_830 = 0; local_830 < this->numberofpointmtrs; local_830 = local_830 + 1) {
        fprintf(pFVar1,"%.16g ",this->pointmtrlist[local_82c * this->numberofpointmtrs + local_830])
        ;
      }
      fprintf(pFVar1,"\n");
    }
    fclose(pFVar1);
  }
  return;
}

Assistant:

void tetgenio::save_nodes(char* filebasename)
{
  FILE *fout;
  char outnodefilename[FILENAMESIZE];
  char outmtrfilename[FILENAMESIZE];
  int i, j;

  sprintf(outnodefilename, "%s.node", filebasename);
  printf("Saving nodes to %s\n", outnodefilename);
  fout = fopen(outnodefilename, "w");
  fprintf(fout, "%d  %d  %d  %d\n", numberofpoints, mesh_dim,
          numberofpointattributes, pointmarkerlist != NULL ? 1 : 0);
  for (i = 0; i < numberofpoints; i++) {
    if (mesh_dim == 2) {
      fprintf(fout, "%d  %.16g  %.16g", i + firstnumber, pointlist[i * 3],
              pointlist[i * 3 + 1]);
    } else {
      fprintf(fout, "%d  %.16g  %.16g  %.16g", i + firstnumber,
              pointlist[i * 3], pointlist[i * 3 + 1], pointlist[i * 3 + 2]);
    }
    for (j = 0; j < numberofpointattributes; j++) {
      fprintf(fout, "  %.16g", 
              pointattributelist[i * numberofpointattributes + j]);
    }
    if (pointmarkerlist != NULL) {
      fprintf(fout, "  %d", pointmarkerlist[i]);
    }
    fprintf(fout, "\n");
  }
  fclose(fout);

  // If the point metrics exist, output them to a .mtr file.
  if ((numberofpointmtrs > 0) && (pointmtrlist != (REAL *) NULL)) {
    sprintf(outmtrfilename, "%s.mtr", filebasename);
    printf("Saving metrics to %s\n", outmtrfilename);
    fout = fopen(outmtrfilename, "w");
    fprintf(fout, "%d  %d\n", numberofpoints, numberofpointmtrs);
    for (i = 0; i < numberofpoints; i++) {
      for (j = 0; j < numberofpointmtrs; j++) {
        fprintf(fout, "%.16g ", pointmtrlist[i * numberofpointmtrs + j]);
      }
      fprintf(fout, "\n");
    }
    fclose(fout);
  }
}